

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O0

void __thiscall
CompileScriptException::CopyInto(CompileScriptException *this,CompileScriptException *pse)

{
  OLECHAR *psz;
  UINT len;
  BSTR pWVar1;
  CompileScriptException *pse_local;
  CompileScriptException *this_local;
  
  ScriptException::CopyInto(&this->super_ScriptException,&pse->super_ScriptException);
  pse->line = this->line;
  pse->ichMinLine = this->ichMinLine;
  pse->hasLineNumberInfo = (bool)(this->hasLineNumberInfo & 1);
  if (this->bstrLine != (BSTR)0x0) {
    psz = this->bstrLine;
    len = SysStringLen(this->bstrLine);
    pWVar1 = SysAllocStringLen(psz,len);
    pse->bstrLine = pWVar1;
  }
  return;
}

Assistant:

void CompileScriptException::CopyInto(CompileScriptException* pse)
{
    ScriptException::CopyInto(pse);

    pse->line = this->line;
    pse->ichMinLine = this->ichMinLine;
    pse->hasLineNumberInfo = this->hasLineNumberInfo;

    if (this->bstrLine)
    {
        pse->bstrLine = SysAllocStringLen(this->bstrLine, SysStringLen(this->bstrLine));
    }
}